

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O0

int __thiscall
ncnn::Mat::clone(Mat *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  void *__dest;
  bool bVar1;
  size_t sVar2;
  Mat *m;
  Mat *in_stack_ffffffffffffffa0;
  void *__src;
  Allocator *in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  int iVar3;
  Mat *this_00;
  
  this_00 = this;
  bVar1 = empty(in_stack_ffffffffffffffa0);
  if (bVar1) {
    Mat(this);
    iVar3 = (int)this_00;
  }
  else {
    Mat(this);
    iVar3 = (int)((ulong)this >> 0x20);
    if (*(int *)(__fn + 0x20) == 1) {
      create(this_00,iVar3,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      iVar3 = (int)this_00;
    }
    else if (*(int *)(__fn + 0x20) == 2) {
      create(this_00,iVar3,(int)this,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      iVar3 = (int)this_00;
    }
    else {
      if (*(int *)(__fn + 0x20) == 3) {
        create(this_00,iVar3,(int)this,(int)(in_stack_ffffffffffffffb0 >> 0x20),
               (size_t)in_stack_ffffffffffffffa8,(Allocator *)in_stack_ffffffffffffffa0);
      }
      iVar3 = (int)this_00;
    }
    sVar2 = total((Mat *)__fn);
    if (sVar2 != 0) {
      __dest = this->data;
      __src = *(void **)__fn;
      sVar2 = total((Mat *)__fn);
      memcpy(__dest,__src,sVar2 * *(long *)(__fn + 0x10));
    }
  }
  return iVar3;
}

Assistant:

inline Mat Mat::clone(Allocator* allocator) const
{
    if (empty())
        return Mat();

    Mat m;
    if (dims == 1)
        m.create(w, elemsize, allocator);
    else if (dims == 2)
        m.create(w, h, elemsize, allocator);
    else if (dims == 3)
        m.create(w, h, c, elemsize, allocator);

    if (total() > 0)
    {
        memcpy(m.data, data, total() * elemsize);
    }

    return m;
}